

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O3

string * __thiscall helics::InputInfo::getSourceName_abi_cxx11_(InputInfo *this,GlobalHandle source)

{
  string *psVar1;
  
  if (getSourceName[abi:cxx11](helics::GlobalHandle)::empty_abi_cxx11_ == '\0') {
    getSourceName_abi_cxx11_();
  }
  if ((this->input_sources).
      super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->input_sources).
      super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
      super__Vector_impl_data._M_start) {
    psVar1 = &getSourceName[abi:cxx11](helics::GlobalHandle)::empty_abi_cxx11_;
  }
  else {
    psVar1 = &((this->source_info).
               super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
               ._M_impl.super__Vector_impl_data._M_start)->key;
  }
  return psVar1;
}

Assistant:

const std::string& InputInfo::getSourceName(GlobalHandle source) const
{
    static const std::string empty{};
    size_t ii{0};
    while (ii < input_sources.size()) {
        if (source == input_sources[ii]) {
            return source_info[ii].key;
        }
    }
    return empty;
}